

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O0

TPM_SOCKET_HANDLE tpm_socket_create(char *address,unsigned_short port)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  sockaddr_in SockAddr;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM_SOCKET_INFO *result;
  unsigned_short port_local;
  char *address_local;
  
  l = (LOGGER_LOG)malloc(0x18);
  if (l == (LOGGER_LOG)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_create",0xcc,1,"Failure: malloc socket communication info.");
    }
  }
  else {
    memset(l,0,0x18);
    iVar1 = socket(2,1,0);
    *(int *)l = iVar1;
    if (iVar1 == -1) {
      SockAddr.sin_zero = (uchar  [8])xlogging_get_log_function();
      if (SockAddr.sin_zero != (uchar  [8])0x0) {
        (*(code *)SockAddr.sin_zero)
                  (0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                   ,"tpm_socket_create",0xd9,1,"Failure: connecting to tpm simulator.");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      memset(&l_2,0,0x10);
      l_2._0_2_ = 2;
      l_2._2_2_ = htons(port);
      l_2._4_4_ = inet_addr(address);
      iVar1 = connect(*(int *)l,(sockaddr *)&l_2,0x10);
      if (iVar1 < 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                    ,"tpm_socket_create",0xe7,1,"Failure: connecting to tpm simulator.");
        }
        close_socket(*(int *)l);
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (TPM_SOCKET_HANDLE)l;
}

Assistant:

TPM_SOCKET_HANDLE tpm_socket_create(const char* address, unsigned short port)
{
    TPM_SOCKET_INFO* result;
    if ((result = malloc(sizeof(TPM_SOCKET_INFO))) == NULL)
    {
        LogError("Failure: malloc socket communication info.");
    }
    else
    {
#ifdef WIN32
        WSADATA wsaData;
        WSAStartup(MAKEWORD(2, 0), &wsaData);
#endif

        memset(result, 0, sizeof(TPM_SOCKET_INFO));

        if ((result->socket_conn = socket(AF_INET, SOCK_STREAM, 0)) == INVALID_SOCKET)
        {
            LogError("Failure: connecting to tpm simulator.");
            free(result);
            result = NULL;
        }
        else
        {
            struct sockaddr_in SockAddr;
            memset(&SockAddr, 0, sizeof(SockAddr));
            SockAddr.sin_family = AF_INET;
            SockAddr.sin_port = htons(port);
            SockAddr.sin_addr.s_addr = inet_addr(address);

            if (connect(result->socket_conn, (struct sockaddr*)&SockAddr, sizeof(SockAddr)) < 0)
            {
                LogError("Failure: connecting to tpm simulator.");
                close_socket(result->socket_conn);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}